

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Type *message;
  Type *enum_type;
  Type *service;
  FileOptions *options;
  FileDescriptorProto *in_RCX;
  FileDescriptorProto *in_R9;
  LocationRecorder location;
  LocationRecorder local_48;
  long local_38;
  
  bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar3 = true;
  if (!bVar2) {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 == 0) {
      LocationRecorder::LocationRecorder
                (&local_48,root_location,4,
                 (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
      message = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&(file->message_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
      bVar3 = ParseMessageDefinition(this,message,&local_48,file);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar4 == 0) {
        LocationRecorder::LocationRecorder
                  (&local_48,root_location,5,
                   (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
        enum_type = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                              (&(file->enum_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
        bVar3 = ParseEnumDefinition(this,enum_type,&local_48,file);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar4 == 0) {
          LocationRecorder::LocationRecorder
                    (&local_48,root_location,6,
                     (file->service_).super_RepeatedPtrFieldBase.current_size_);
          service = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                              (&(file->service_).super_RepeatedPtrFieldBase,(Type *)0x0);
          bVar3 = ParseServiceDefinition(this,service,&local_48,file);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar4 == 0) {
            LocationRecorder::LocationRecorder(&local_48,root_location,7);
            bVar3 = ParseExtend(this,&file->extension_,&file->message_type_,root_location,4,
                                &local_48,file);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar4 == 0) {
              bVar2 = ParseImport(this,&file->dependency_,&file->public_dependency_,
                                  &file->weak_dependency_,root_location,in_R9);
              return bVar2;
            }
            iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar4 == 0) {
              bVar2 = ParsePackage(this,file,root_location,in_RCX);
              return bVar2;
            }
            iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar4 != 0) {
              local_48.parser_ = (Parser *)&stack0xffffffffffffffc8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_48,"Expected top-level statement (e.g. \"message\").","");
              pEVar1 = this->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,&local_48);
              }
              this->had_errors_ = true;
              if (local_48.parser_ != (Parser *)&stack0xffffffffffffffc8) {
                operator_delete(local_48.parser_,local_38 + 1);
              }
              return false;
            }
            LocationRecorder::LocationRecorder(&local_48,root_location,8);
            options = FileDescriptorProto::mutable_options(file);
            bVar3 = ParseOption(this,&options->super_Message,&local_48,file,OPTION_STATEMENT);
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&local_48);
  }
  return bVar3;
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kMessageTypeFieldNumber, file->message_type_size());
    return ParseMessageDefinition(file->add_message_type(), location, file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kEnumTypeFieldNumber, file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), location, file);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kServiceFieldNumber, file->service_size());
    return ParseServiceDefinition(file->add_service(), location, file);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(file->mutable_extension(),
                       file->mutable_message_type(),
                       root_location,
                       FileDescriptorProto::kMessageTypeFieldNumber,
                       location, file);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(),
                       root_location, file);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location, file);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, file,
                       OPTION_STATEMENT);
  } else {
    AddError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}